

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNode.cpp
# Opt level: O1

void __thiscall ODDLParser::DDLNode::attachParent(DDLNode *this,DDLNode *parent)

{
  pointer *pppDVar1;
  iterator __position;
  DDLNode *local_8;
  
  if ((this->m_parent != parent) && (this->m_parent = parent, parent != (DDLNode *)0x0)) {
    __position._M_current =
         (parent->m_children).
         super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (parent->m_children).
        super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_8 = this;
      std::vector<ODDLParser::DDLNode*,std::allocator<ODDLParser::DDLNode*>>::
      _M_realloc_insert<ODDLParser::DDLNode*>
                ((vector<ODDLParser::DDLNode*,std::allocator<ODDLParser::DDLNode*>> *)
                 &parent->m_children,__position,&local_8);
    }
    else {
      *__position._M_current = this;
      pppDVar1 = &(parent->m_children).
                  super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppDVar1 = *pppDVar1 + 1;
    }
  }
  return;
}

Assistant:

void DDLNode::attachParent( DDLNode *parent ) {
    if( m_parent == parent ) {
        return;
    }

    m_parent = parent;
    if( ddl_nullptr != m_parent ) {
        m_parent->m_children.push_back( this );
    }
}